

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O1

ssize_t __thiscall axl::io::Ssl::read(Ssl *this,int __fd,void *__buf,size_t __nbytes)

{
  uint retCode;
  ulong uVar1;
  undefined4 in_register_00000034;
  
  retCode = SSL_read((SSL *)(this->
                            super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).m_h,
                     (void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  if ((int)retCode < 0) {
    setError(this,retCode);
    uVar1 = 0xffffffffffffffff;
  }
  else {
    uVar1 = (ulong)retCode;
  }
  return uVar1;
}

Assistant:

size_t
Ssl::read(
	void* p,
	size_t size
) {
	ASSERT(m_h);

	int result = ::SSL_read(m_h, p, (int)size);
	if (result < 0) {
		setError(result);
		return -1;
	}

	return result;
}